

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_widget_layout_states nk_widget(nk_rect *bounds,nk_context *ctx)

{
  nk_panel *pnVar1;
  undefined1 auVar2 [16];
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 extraout_EAX;
  int iVar7;
  nk_widget_layout_states nVar8;
  float x0;
  float y0;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  nk_rect v;
  nk_rect local_28;
  
  nVar8 = NK_WIDGET_INVALID;
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (nVar8 = NK_WIDGET_INVALID, ctx->current->layout != (nk_panel *)0x0)) {
    nk_panel_alloc_space(bounds,ctx);
    pnVar1 = ctx->current->layout;
    uVar3 = (pnVar1->clip).x;
    uVar4 = (pnVar1->clip).y;
    uVar5 = (pnVar1->clip).w;
    uVar6 = (pnVar1->clip).h;
    fVar11 = bounds->w;
    fVar12 = bounds->h;
    x0 = (float)(int)bounds->x;
    y0 = (float)(int)bounds->y;
    bounds->x = x0;
    bounds->y = y0;
    bounds->w = (float)(int)fVar11;
    bounds->h = (float)(int)fVar12;
    fVar9 = (float)(int)(float)uVar3;
    fVar10 = (float)(int)(float)uVar4;
    local_28.y = fVar10;
    local_28.x = fVar9;
    local_28.h = (float)(int)(float)uVar6;
    local_28.w = (float)(int)(float)uVar5;
    fVar11 = (float)(int)fVar11 + x0;
    fVar12 = (float)(int)fVar12 + y0;
    nk_unify(&v,&local_28,x0,y0,fVar11,fVar12);
    auVar2._4_4_ = -(uint)(x0 < (float)(int)(float)uVar5 + fVar9);
    auVar2._0_4_ = -(uint)(fVar9 < fVar11);
    auVar2._8_4_ = -(uint)(fVar10 < fVar12);
    auVar2._12_4_ = -(uint)(y0 < (float)(int)(float)uVar6 + fVar10);
    iVar7 = movmskps(extraout_EAX,auVar2);
    if (iVar7 == 0xf) {
      fVar11 = (ctx->input).mouse.pos.x;
      nVar8 = NK_WIDGET_ROM;
      if ((v.x <= fVar11) && (fVar11 < v.x + v.w)) {
        fVar11 = (ctx->input).mouse.pos.y;
        if ((v.y <= fVar11) && (fVar11 < v.y + v.h)) {
          nVar8 = NK_WIDGET_VALID;
        }
      }
    }
  }
  return nVar8;
}

Assistant:

NK_API enum nk_widget_layout_states
nk_widget(struct nk_rect *bounds, const struct nk_context *ctx)
{
struct nk_rect c, v;
struct nk_window *win;
struct nk_panel *layout;
const struct nk_input *in;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return NK_WIDGET_INVALID;

/* allocate space and check if the widget needs to be updated and drawn */
nk_panel_alloc_space(bounds, ctx);
win = ctx->current;
layout = win->layout;
in = &ctx->input;
c = layout->clip;

/*  if one of these triggers you forgot to add an `if` condition around either
        a window, group, popup, combobox or contextual menu `begin` and `end` block.
        Example:
            if (nk_begin(...) {...} nk_end(...); or
            if (nk_group_begin(...) { nk_group_end(...);} */
NK_ASSERT(!(layout->flags & NK_WINDOW_MINIMIZED));
NK_ASSERT(!(layout->flags & NK_WINDOW_HIDDEN));
NK_ASSERT(!(layout->flags & NK_WINDOW_CLOSED));

/* need to convert to int here to remove floating point errors */
bounds->x = (float)((int)bounds->x);
bounds->y = (float)((int)bounds->y);
bounds->w = (float)((int)bounds->w);
bounds->h = (float)((int)bounds->h);

c.x = (float)((int)c.x);
c.y = (float)((int)c.y);
c.w = (float)((int)c.w);
c.h = (float)((int)c.h);

nk_unify(&v, &c, bounds->x, bounds->y, bounds->x + bounds->w, bounds->y + bounds->h);
if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds->x, bounds->y, bounds->w, bounds->h))
return NK_WIDGET_INVALID;
if (!NK_INBOX(in->mouse.pos.x, in->mouse.pos.y, v.x, v.y, v.w, v.h))
return NK_WIDGET_ROM;
return NK_WIDGET_VALID;
}